

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  undefined8 *puVar1;
  size_type *psVar2;
  tm *ptVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  ulong uVar7;
  undefined8 uVar8;
  tm time_struct;
  time_t seconds;
  undefined8 *local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 *local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 *local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8;
  long lStack_1c0;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8;
  long lStack_1a0;
  ulong *local_198;
  long local_190;
  ulong local_188;
  long lStack_180;
  ulong *local_178;
  long local_170;
  ulong local_168;
  long lStack_160;
  ulong *local_158;
  long local_150;
  ulong local_148;
  long lStack_140;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  int local_94;
  tm local_90;
  long local_58;
  string local_50;
  
  local_58 = (long)this / 1000;
  ptVar3 = localtime_r(&local_58,&local_90);
  if (ptVar3 == (tm *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  local_94 = local_90.tm_year + 0x76c;
  StreamableToString<int>(&local_50,&local_94);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_1c8 = *puVar6;
    lStack_1c0 = plVar4[3];
    local_1d8 = &local_1c8;
  }
  else {
    local_1c8 = *puVar6;
    local_1d8 = (ulong *)*plVar4;
  }
  local_1d0 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_b8,(String *)(ulong)(local_90.tm_mon + 1),(int)local_1d0);
  uVar7 = 0xf;
  if (local_1d8 != &local_1c8) {
    uVar7 = local_1c8;
  }
  if (uVar7 < local_b8._M_string_length + local_1d0) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      uVar8 = local_b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_b8._M_string_length + local_1d0) goto LAB_0013664f;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_1d8);
  }
  else {
LAB_0013664f:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_b8._M_dataplus._M_p);
  }
  local_258 = &local_248;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_248 = *puVar1;
    uStack_240 = puVar5[3];
  }
  else {
    local_248 = *puVar1;
    local_258 = (undefined8 *)*puVar5;
  }
  local_250 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_258);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_1a8 = *puVar6;
    lStack_1a0 = plVar4[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *puVar6;
    local_1b8 = (ulong *)*plVar4;
  }
  local_1b0 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_d8,(String *)(ulong)(uint)local_90.tm_mday,(int)local_1b0);
  uVar7 = 0xf;
  if (local_1b8 != &local_1a8) {
    uVar7 = local_1a8;
  }
  if (uVar7 < local_d8._M_string_length + local_1b0) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      uVar8 = local_d8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_d8._M_string_length + local_1b0) goto LAB_00136785;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_1b8);
  }
  else {
LAB_00136785:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_d8._M_dataplus._M_p);
  }
  local_238 = &local_228;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_228 = *puVar1;
    uStack_220 = puVar5[3];
  }
  else {
    local_228 = *puVar1;
    local_238 = (undefined8 *)*puVar5;
  }
  local_230 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_188 = *puVar6;
    lStack_180 = plVar4[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *puVar6;
    local_198 = (ulong *)*plVar4;
  }
  local_190 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_f8,(String *)(ulong)(uint)local_90.tm_hour,(int)local_190);
  uVar7 = 0xf;
  if (local_198 != &local_188) {
    uVar7 = local_188;
  }
  if (uVar7 < local_f8._M_string_length + local_190) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      uVar8 = local_f8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_f8._M_string_length + local_190) goto LAB_001368c0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_198);
  }
  else {
LAB_001368c0:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_f8._M_dataplus._M_p);
  }
  local_218 = &local_208;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_208 = *puVar1;
    uStack_200 = puVar5[3];
  }
  else {
    local_208 = *puVar1;
    local_218 = (undefined8 *)*puVar5;
  }
  local_210 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_218);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_168 = *puVar6;
    lStack_160 = plVar4[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *puVar6;
    local_178 = (ulong *)*plVar4;
  }
  local_170 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_118,(String *)(ulong)(uint)local_90.tm_min,(int)local_170);
  uVar7 = 0xf;
  if (local_178 != &local_168) {
    uVar7 = local_168;
  }
  if (uVar7 < local_118._M_string_length + local_170) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      uVar8 = local_118.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_118._M_string_length + local_170) goto LAB_001369fa;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_178);
  }
  else {
LAB_001369fa:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_118._M_dataplus._M_p);
  }
  local_1f8 = &local_1e8;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_1e8 = *puVar1;
    uStack_1e0 = puVar5[3];
  }
  else {
    local_1e8 = *puVar1;
    local_1f8 = (undefined8 *)*puVar5;
  }
  local_1f0 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_148 = *puVar6;
    lStack_140 = plVar4[3];
    local_158 = &local_148;
  }
  else {
    local_148 = *puVar6;
    local_158 = (ulong *)*plVar4;
  }
  local_150 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  String::FormatIntWidth2_abi_cxx11_
            (&local_138,(String *)(ulong)(uint)local_90.tm_sec,(int)local_150);
  uVar7 = 0xf;
  if (local_158 != &local_148) {
    uVar7 = local_148;
  }
  if (uVar7 < local_138._M_string_length + local_150) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      uVar8 = local_138.field_2._M_allocated_capacity;
    }
    if (local_138._M_string_length + local_150 <= (ulong)uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_158);
      goto LAB_00136b5b;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_138._M_dataplus._M_p);
LAB_00136b5b:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar2) {
    uVar8 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar2;
  puVar5[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  time_t seconds = static_cast<time_t>(ms / 1000);
  struct tm time_struct;
#ifdef _MSC_VER
  if (localtime_s(&time_struct, &seconds) != 0)
    return "";  // Invalid ms value
#else
  if (localtime_r(&seconds, &time_struct) == NULL)
    return "";  // Invalid ms value
#endif

  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct.tm_mday) + "T" +
      String::FormatIntWidth2(time_struct.tm_hour) + ":" +
      String::FormatIntWidth2(time_struct.tm_min) + ":" +
      String::FormatIntWidth2(time_struct.tm_sec);
}